

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O3

spv_result_t spvtools::val::AnnotationPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  spv_result_t sVar2;
  pointer ppVar3;
  _Rb_tree_const_iterator<spvtools::val::Decoration> __first;
  ValidationState_t *pVVar4;
  bool bVar5;
  uint16_t uVar6;
  Decoration DVar7;
  uint uVar8;
  uint uVar9;
  FPFastMathModeMask FVar10;
  Instruction *pIVar11;
  _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
  *p_Var12;
  mapped_type *pmVar13;
  pointer puVar14;
  long lVar15;
  pointer ppVar16;
  ulong uVar17;
  char *pcVar18;
  _Alloc_hider _Var19;
  size_t sVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dec_params;
  string local_258;
  ValidationState_t *local_230;
  string local_228;
  undefined1 local_208 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_200;
  uint local_1e8;
  spv_result_t local_38;
  
  uVar6 = (inst->inst_).opcode;
  switch(uVar6) {
  case 0x47:
    DVar7 = Instruction::GetOperandAs<spv::Decoration>(inst,1);
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if (pIVar11 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "target is not defined";
      lVar15 = 0x15;
LAB_0013965f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
LAB_00139671:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
    else {
      bVar5 = spvIsVulkanEnv(_->context_->target_env);
      if (((DVar7 & ~DecorationSpecId) != DecorationGLSLShared) || (!bVar5)) {
        if ((int)DVar7 < 0x2e) {
          if (DVar7 != DecorationUniformId) {
            if (DVar7 == DecorationFPFastMathMode) {
              bVar5 = ValidationState_t::HasDecoration(_,uVar8,DecorationNoContraction);
              if (bVar5) goto LAB_0013963b;
              FVar10 = Instruction::GetOperandAs<spv::FPFastMathModeMask>(inst,2);
              if ((~FVar10 & 0x30000) != 0 && (FVar10 >> 0x12 & 1) != 0) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar18 = 
                "AllowReassoc and AllowContract must be specified when AllowTransform is specified";
                lVar15 = 0x51;
                goto LAB_0013965f;
              }
            }
            else if ((DVar7 == DecorationNoContraction) &&
                    (bVar5 = ValidationState_t::HasDecoration(_,uVar8,DecorationFPFastMathMode),
                    bVar5)) {
LAB_0013963b:
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              pcVar18 = "FPFastMathMode and NoContraction cannot decorate the same target";
              lVar15 = 0x40;
              goto LAB_0013965f;
            }
LAB_001399fd:
            if ((pIVar11->inst_).opcode == 0x49) break;
            if ((DVar7 < DecorationGLSLShared) && ((0xb0U >> (DVar7 & Component) & 1) != 0)) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              ValidationState_t::SpvDecorationString_abi_cxx11_(&local_258,_,DVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," can only be applied to structure members",0x29);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            }
            else {
              local_38 = anon_unknown_3::ValidateDecorationTarget(_,DVar7,inst,pIVar11);
            }
            goto joined_r0x00139b05;
          }
        }
        else if ((1 < DVar7 - AlignmentId) && (DVar7 != CounterBuffer)) goto LAB_001399fd;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar18 = "Decorations taking ID parameters may not be used with OpDecorateId";
        lVar15 = 0x42;
        goto LAB_0013965f;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x123d,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpDecorate decoration \'",0x17);
      ValidationState_t::SpvDecorationString_abi_cxx11_(&local_228,_,DVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p)
                 ,local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"\' is not valid for the Vulkan execution environment.",0x34);
      sVar2 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p) !=
          &local_228.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p),
                        local_228.field_2._M_allocated_capacity + 1);
      }
LAB_00138f53:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      local_38 = sVar2;
    }
joined_r0x00139b05:
    if (local_38 != SPV_SUCCESS) {
      return local_38;
    }
    break;
  case 0x48:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x1e)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpMemberDecorate Structure type <id> ",0x25);
LAB_00139344:
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      local_258._M_string_length = 0x16;
      _Var19._M_p = " is not a struct type.";
LAB_00139368:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,_Var19._M_p,local_258._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00139671;
    }
    local_230 = _;
    uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pVVar4 = local_230;
    if ((int)((ulong)((long)(pIVar11->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pIVar11->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) - 2U <= uVar9) {
      ValidationState_t::diag((DiagnosticStream *)local_208,local_230,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Index ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," provided in OpMemberDecorate for struct <id> ",0x2e);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,pVVar4,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," is out of bounds. The structure has ",0x25);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," members. Largest valid index is ",0x21);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
      sVar2 = local_38;
LAB_00139518:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      _ = local_230;
      local_38 = sVar2;
      goto joined_r0x00139b05;
    }
    DVar7 = Instruction::GetOperandAs<spv::Decoration>(inst,2);
    pVVar4 = local_230;
    _ = local_230;
    if ((int)DVar7 < 0x1175) {
      if ((DVar7 < (DecorationIndex|Centroid)) &&
         ((0xffc71c50074eU >> ((ulong)DVar7 & 0x3f) & 1) != 0)) {
LAB_0013922c:
        ValidationState_t::diag((DiagnosticStream *)local_208,local_230,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::SpvDecorationString_abi_cxx11_(&local_258,pVVar4,DVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," cannot be applied to structure members",0x27);
        sVar2 = local_38;
        goto LAB_00139518;
      }
    }
    else if ((((DVar7 - DecorationNonUniform < 0x39) &&
              ((0x180000000000001U >> ((ulong)(DVar7 - DecorationNonUniform) & 0x3f) & 1) != 0)) ||
             (DVar7 - DecorationNoSignedWrap < 2)) || (DVar7 == CounterBuffer)) goto LAB_0013922c;
    break;
  case 0x49:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    ppVar3 = (pIVar11->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar16 = (pIVar11->uses_).
                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar3;
        ppVar16 = ppVar16 + 1) {
      uVar1 = (ppVar16->first->inst_).opcode;
      if ((((4 < uVar1 - 0x47) || ((0x19U >> (uVar1 - 0x47 & 0x1f) & 1) == 0)) && (uVar1 != 5)) &&
         ((uVar1 != 0x14c && (bVar5 = Instruction::IsNonSemantic(ppVar16->first), !bVar5)))) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Result id of OpDecorationGroup can only ",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"be targeted by OpName, OpGroupDecorate, ",0x28);
        pcVar18 = "OpDecorate, OpDecorateId, and OpGroupMemberDecorate";
        lVar15 = 0x33;
        goto LAB_0013965f;
      }
    }
    break;
  case 0x4a:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x49)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpGroupDecorate Decoration group <id> ";
      lVar15 = 0x26;
LAB_001392d4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      local_258._M_string_length = 0x1b;
      _Var19._M_p = " is not a decoration group.";
      goto LAB_00139368;
    }
    if (0x10 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar20 = 1;
      uVar8 = 2;
      do {
        uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,sVar20);
        pIVar11 = ValidationState_t::FindDef(_,uVar9);
        if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode == 0x49)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpGroupDecorate may not target OpDecorationGroup <id> ",
                     0x36);
          ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar9);
          _Var19._M_p = local_258._M_dataplus._M_p;
          goto LAB_00139368;
        }
        sVar20 = (size_t)uVar8;
        uVar8 = uVar8 + 1;
      } while (sVar20 < (ulong)((long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    break;
  case 0x4b:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar11 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x49)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpGroupMemberDecorate Decoration group <id> ";
      lVar15 = 0x2c;
      goto LAB_001392d4;
    }
    if (0x20 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar20 = 2;
      do {
        uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,sVar20 - 1);
        uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,sVar20);
        pIVar11 = ValidationState_t::FindDef(_,uVar8);
        if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x1e)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpGroupMemberDecorate Structure type <id> ",0x2a);
          goto LAB_00139344;
        }
        if ((int)((ulong)((long)(pIVar11->words_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pIVar11->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2) - 2U <= uVar9) {
          local_230 = _;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Index ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," provided in OpGroupMemberDecorate for struct <id> ",0x33
                    );
          ValidationState_t::getIdName_abi_cxx11_(&local_258,local_230,uVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," is out of bounds. The structure has ",0x25);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," members. Largest valid index is ",0x21);
          std::ostream::_M_insert<unsigned_long>((ulong)local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
          sVar2 = local_38;
          goto LAB_00138f53;
        }
        sVar20 = sVar20 + 2;
      } while (sVar20 < (ulong)((long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    break;
  default:
    if (uVar6 == 0x14c) {
      DVar7 = Instruction::GetOperandAs<spv::Decoration>(inst,1);
      if (((DecorationMaxByteOffsetId < DVar7) ||
          ((0xc00008000000U >> ((ulong)DVar7 & 0x3f) & 1) == 0)) && (DVar7 != CounterBuffer)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar18 = "Decorations that don\'t take ID parameters may not be used with OpDecorateId";
        lVar15 = 0x4b;
        goto LAB_0013965f;
      }
      break;
    }
    goto LAB_00139688;
  }
  uVar6 = (inst->inst_).opcode;
LAB_00139688:
  switch(uVar6) {
  case 0x48:
    puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar9 = puVar14[1];
    uVar8 = puVar14[2];
    DVar7 = puVar14[3];
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    if (0x10 < (ulong)((long)(inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar14)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_258,0,puVar14 + 4);
    }
    local_208._0_4_ = DVar7;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_200,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_258);
    local_1e8 = uVar8;
LAB_00139762:
    local_228._M_dataplus._M_p._0_4_ = uVar9;
    p_Var12 = (_Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
               *)std::
                 map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                 ::operator[](&_->id_decorations_,(key_type *)&local_228);
    std::
    _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
    ::_M_insert_unique<spvtools::val::Decoration_const&>(p_Var12,(Decoration *)local_208);
    if (local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_200.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_258._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_258._M_dataplus._M_p,
                      local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p);
    }
    break;
  case 0x49:
    break;
  case 0x4a:
    local_208._0_4_ =
         (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    pmVar13 = std::
              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
              ::operator[](&_->id_decorations_,(key_type *)local_208);
    puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(inst->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar14)) {
      uVar17 = 2;
      do {
        local_208._0_4_ = puVar14[uVar17];
        __first._M_node = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var12 = (_Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
                   *)std::
                     map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                     ::operator[](&_->id_decorations_,(key_type *)local_208);
        std::
        _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
                  (p_Var12,__first,
                   (_Rb_tree_const_iterator<spvtools::val::Decoration>)
                   &(pmVar13->_M_t)._M_impl.super__Rb_tree_header);
        uVar17 = uVar17 + 1;
        puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar17 < (ulong)((long)(inst->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar14 >>
                               2));
    }
    break;
  case 0x4b:
    local_208._0_4_ =
         (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    pmVar13 = std::
              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
              ::operator[](&_->id_decorations_,(key_type *)local_208);
    puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (0xc < (ulong)((long)(inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar14)) {
      uVar17 = 3;
      do {
        ValidationState_t::
        RegisterDecorationsForStructMember<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
                  (_,puVar14[uVar17 - 1],puVar14[uVar17],
                   (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<spvtools::val::Decoration>)
                   &(pmVar13->_M_t)._M_impl.super__Rb_tree_header);
        puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar17 = uVar17 + 2;
      } while (uVar17 < (ulong)((long)(inst->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar14 >>
                               2));
    }
    break;
  default:
    if (uVar6 != 0x14c) {
      return SPV_SUCCESS;
    }
  case 0x47:
    puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar9 = puVar14[1];
    DVar7 = puVar14[2];
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    if (0xc < (ulong)((long)(inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar14)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_258,0,puVar14 + 3);
    }
    local_208._0_4_ = DVar7;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_200,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_258);
    local_1e8 = 0xffffffff;
    goto LAB_00139762;
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t AnnotationPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpDecorate:
      if (auto error = ValidateDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorateId:
      if (auto error = ValidateDecorateId(_, inst)) return error;
      break;
    // TODO(dneto): spv::Op::OpDecorateStringGOOGLE
    // See https://github.com/KhronosGroup/SPIRV-Tools/issues/2253
    case spv::Op::OpMemberDecorate:
      if (auto error = ValidateMemberDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorationGroup:
      if (auto error = ValidateDecorationGroup(_, inst)) return error;
      break;
    case spv::Op::OpGroupDecorate:
      if (auto error = ValidateGroupDecorate(_, inst)) return error;
      break;
    case spv::Op::OpGroupMemberDecorate:
      if (auto error = ValidateGroupMemberDecorate(_, inst)) return error;
      break;
    default:
      break;
  }

  // In order to validate decoration rules, we need to know all the decorations
  // that are applied to any given <id>.
  RegisterDecorations(_, inst);

  return SPV_SUCCESS;
}